

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_bias_test.cc
# Opt level: O1

void intgemm::kernel_add_bias_test<(intgemm::CPUType)4,int>(void)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  AlignedVector<int> output;
  AlignedVector<int> bias;
  AlignedVector<int> input;
  AssertionHandler catchAssertionHandler;
  ulong local_108;
  int local_fc;
  AlignedVector<int> local_f8;
  AlignedVector<int> local_e8;
  AlignedVector<int> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  undefined1 *local_a8;
  char *local_a0;
  size_t sStack_98;
  int *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  if (3 < kCPU) {
    AlignedVector<int>::AlignedVector(&local_d8,0x10,0x40);
    AlignedVector<int>::AlignedVector(&local_e8,0x10,0x40);
    AlignedVector<int>::AlignedVector(&local_f8,0x10,0x40);
    if (local_d8.size_ != 0) {
      auVar5 = vpbroadcastq_avx512f();
      auVar6 = vpmovsxbd_avx512f(_DAT_001b8ea0);
      lVar3 = 0;
      auVar7 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar9 = vpbroadcastd_avx512f(ZEXT416(0x10));
      do {
        auVar10 = vpbroadcastq_avx512f();
        auVar11 = vporq_avx512f(auVar10,auVar7);
        auVar10 = vporq_avx512f(auVar10,auVar8);
        vpcmpuq_avx512f(auVar10,auVar5,2);
        vpcmpuq_avx512f(auVar11,auVar5,2);
        auVar10 = vmovdqu32_avx512f(auVar6);
        *(undefined1 (*) [64])((undefined1 *)local_d8.mem_ + lVar3 * 4) = auVar10;
        lVar3 = lVar3 + 0x10;
        auVar6 = vpaddd_avx512f(auVar6,auVar9);
      } while (((local_d8.size_ + 0x3fffffffffffffff & 0x3fffffffffffffff) -
               (ulong)((uint)(local_d8.size_ + 0x3fffffffffffffff) & 0xf)) + 0x10 != lVar3);
    }
    if (local_e8.size_ != 0) {
      auVar5 = vpbroadcastq_avx512f();
      lVar3 = 0;
      auVar6 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar8 = vpbroadcastd_avx512f(ZEXT416(100));
      do {
        auVar9 = vpbroadcastq_avx512f();
        auVar10 = vporq_avx512f(auVar9,auVar6);
        auVar9 = vporq_avx512f(auVar9,auVar7);
        vpcmpuq_avx512f(auVar9,auVar5,2);
        vpcmpuq_avx512f(auVar10,auVar5,2);
        auVar9 = vmovdqu32_avx512f(auVar8);
        *(undefined1 (*) [64])((undefined1 *)local_e8.mem_ + lVar3 * 4) = auVar9;
        lVar3 = lVar3 + 0x10;
      } while (((local_e8.size_ + 0x3fffffffffffffff & 0x3fffffffffffffff) -
               (ulong)((uint)(local_e8.size_ + 0x3fffffffffffffff) & 0xf)) + 0x10 != lVar3);
    }
    auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])local_e8.mem_);
    auVar5 = vpaddd_avx512f(auVar5,*(undefined1 (*) [64])local_d8.mem_);
    auVar5 = vmovdqa64_avx512f(auVar5);
    *(undefined1 (*) [64])local_f8.mem_ = auVar5;
    if (local_f8.size_ != 0) {
      lVar3 = 0;
      local_108 = 0;
      do {
        local_b8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_b8.m_isBinaryExpression = true;
        local_b8.m_result = false;
        local_b8._10_6_ = 0;
        local_c8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/add_bias_test.cc"
        ;
        local_c8.line = 0x1d;
        Catch::StringRef::StringRef(&local_88,"output[i] == ElemType_(100 + i)");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
        piVar2 = local_f8.mem_;
        iVar4 = (int)local_108 + 100;
        iVar1 = *(int *)((undefined1 *)local_f8.mem_ + lVar3);
        local_fc = iVar4;
        Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
        local_b8.m_result = iVar4 == iVar1;
        local_b8.m_isBinaryExpression = true;
        local_a8 = (undefined1 *)piVar2 + lVar3;
        local_b8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed958;
        local_a0 = local_c8.file;
        sStack_98 = local_c8.line;
        local_90 = &local_fc;
        Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
        Catch::ITransientExpression::~ITransientExpression(&local_b8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        local_108 = local_108 + 1;
        lVar3 = lVar3 + 4;
      } while (local_108 < local_f8.size_);
    }
    free(local_f8.mem_);
    free(local_e8.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_add_bias_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static auto VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> bias(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));
  std::fill(bias.begin(), bias.end(), static_cast<ElemType_>(100));

  *output.template as<vec_t>() = kernels::add_bias(*input.template as<vec_t>(), bias.begin(), 0);
  for (std::size_t i = 0; i < output.size(); ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == static_cast<ElemType_>(bias[i] + input[i])); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(100 + i));
#endif
}